

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

string * __thiscall
iutest::internal::FormatForComparisonFailureMessage<std::__cxx11::u16string,std::__cxx11::u16string>
          (string *__return_storage_ptr__,internal *this,
          basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *value,
          basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *param_2)

{
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *param_1_local;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *value_local;
  
  PrintToString<std::__cxx11::u16string>(__return_storage_ptr__,(iutest *)this,value);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string FormatForComparisonFailureMessage(const T1& value, const T2& /*other_operand*/)
{
    return PrintToString(value);
}